

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kfindxx.cpp
# Opt level: O2

void parse_range(int *min,int *max,string *range)

{
  long lVar1;
  int iVar2;
  string sStack_48;
  
  lVar1 = std::__cxx11::string::find((char)range,0x2d);
  if (lVar1 == -1) {
    iVar2 = std::__cxx11::stoi(range,(size_t *)0x0,10);
    *max = iVar2;
    *min = iVar2;
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_48,(ulong)range);
    iVar2 = std::__cxx11::stoi(&sStack_48,(size_t *)0x0,10);
    *min = iVar2;
    std::__cxx11::string::~string((string *)&sStack_48);
    std::__cxx11::string::substr((ulong)&sStack_48,(ulong)range);
    iVar2 = std::__cxx11::stoi(&sStack_48,(size_t *)0x0,10);
    *max = iVar2;
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  return;
}

Assistant:

void
parse_range(int& min, int& max, const std::string& range)
{
    std::size_t dash_pos = range.find('-');

    if (dash_pos == std::string::npos) {
        // Expecting single number.
        min = max = std::stoi(range);
    } else {
        // Expecting two numbers separated by a dash.
        min = std::stoi(range.substr(0, dash_pos));
        max = std::stoi(range.substr(dash_pos + 1, range.length() - dash_pos - 1));
    }
}